

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

void __thiscall Js::ScriptContext::InitializeCache(ScriptContext *this)

{
  bool bVar1;
  Recycler *pRVar2;
  SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *this_00;
  MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
  *ptr;
  SourceContextInfo *ptr_00;
  SRCINFO *ptr_01;
  int mruListCapacity;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  bVar1 = DynamicProfileInfo::NeedProfileInfoList();
  if (bVar1) {
    local_58 = (undefined1  [8])
               &SListBase<Js::DynamicProfileInfo*,Memory::Recycler,RealCount>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_2cb70d5;
    data.filename._0_4_ = 0x4f8;
    pRVar2 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_58);
    this_00 = (SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)
              new<Memory::Recycler>(0x10,pRVar2,0x37a1d4);
    SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>::SListBase(this_00);
    Memory::WriteBarrierPtr<SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>_>::
    WriteBarrierSet(&(((this->super_ScriptContextBase).javascriptLibrary)->cache).profileInfoList,
                    this_00);
  }
  memset(&((this->super_ScriptContextBase).javascriptLibrary)->cache,0,0x280);
  mruListCapacity = 0x10;
  if (0 < DAT_014594a0) {
    mruListCapacity = DAT_014594a0;
  }
  ptr = JsUtil::
        MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
        ::New(this->recycler,mruListCapacity);
  Memory::
  WriteBarrierPtr<JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>_>
  ::WriteBarrierSet(&(((this->super_ScriptContextBase).javascriptLibrary)->cache).dynamicRegexMap,
                    ptr);
  local_58 = (undefined1  [8])&SourceContextInfo::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2cb70d5;
  data.filename._0_4_ = 0x503;
  pRVar2 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_58);
  ptr_00 = (SourceContextInfo *)new<Memory::Recycler>(0x38,pRVar2,0x51e21e);
  (ptr_00->sourceDynamicProfileManager).ptr = (SourceDynamicProfileManager *)0x0;
  ptr_00->dwHostSourceContext = 0xffffffffffffffff;
  ptr_00->isHostDynamicDocument = false;
  ptr_00->sourceContextId = 0xffffffff;
  Memory::WriteBarrierPtr<SourceContextInfo>::WriteBarrierSet
            (&(((this->super_ScriptContextBase).javascriptLibrary)->cache).
              noContextSourceContextInfo,ptr_00);
  local_58 = (undefined1  [8])&SRCINFO::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2cb70d5;
  data.filename._0_4_ = 0x509;
  pRVar2 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_58);
  ptr_01 = (SRCINFO *)new<Memory::Recycler>(0x28,pRVar2,0x51e21e);
  (ptr_01->sourceContextInfo).ptr = (SourceContextInfo *)0x0;
  Memory::WriteBarrierPtr<SourceContextInfo>::operator=
            ((WriteBarrierPtr<SourceContextInfo> *)ptr_01,
             &(((this->super_ScriptContextBase).javascriptLibrary)->cache).
              noContextSourceContextInfo);
  ptr_01->moduleID = 0;
  Memory::WriteBarrierPtr<SRCINFO>::WriteBarrierSet
            (&(((this->super_ScriptContextBase).javascriptLibrary)->cache).noContextGlobalSourceInfo
             ,ptr_01);
  return;
}

Assistant:

void ScriptContext::InitializeCache()
    {

#if ENABLE_PROFILE_INFO
#if DBG_DUMP || defined(DYNAMIC_PROFILE_STORAGE) || defined(RUNTIME_DATA_COLLECTION)
        if (DynamicProfileInfo::NeedProfileInfoList())
        {
            this->Cache()->profileInfoList = RecyclerNew(this->GetRecycler(), DynamicProfileInfoList);
        }
#endif
#endif

        ClearArray(this->Cache()->propertyStrings, 80);
        this->Cache()->dynamicRegexMap =
            RegexPatternMruMap::New(
                recycler,
                REGEX_CONFIG_FLAG(DynamicRegexMruListSize) <= 0 ? 16 : REGEX_CONFIG_FLAG(DynamicRegexMruListSize));

        SourceContextInfo* sourceContextInfo = RecyclerNewStructZ(this->GetRecycler(), SourceContextInfo);
        sourceContextInfo->dwHostSourceContext = Js::Constants::NoHostSourceContext;
        sourceContextInfo->isHostDynamicDocument = false;
        sourceContextInfo->sourceContextId = Js::Constants::NoSourceContext;
        this->Cache()->noContextSourceContextInfo = sourceContextInfo;

        SRCINFO* srcInfo = RecyclerNewStructZ(this->GetRecycler(), SRCINFO);
        srcInfo->sourceContextInfo = this->Cache()->noContextSourceContextInfo;
        srcInfo->moduleID = kmodGlobal;
        this->Cache()->noContextGlobalSourceInfo = srcInfo;
    }